

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O2

size_t __thiscall MonahanPlanner::GetNrVectors(MonahanPlanner *this)

{
  uint uVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  uint uVar4;
  ulong __n;
  size_t sVar5;
  
  sVar5 = 0;
  for (uVar4 = 0; __n = (ulong)uVar4,
      ((long)(this->_m_qFunction).
             super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_qFunction).
            super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18 != __n; uVar4 = uVar4 + 1) {
    uVar1 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               ::at(&this->_m_qFunction,__n);
      if (((long)(pvVar2->
                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar2->
                super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18 == (ulong)uVar1) break;
      pvVar2 = std::
               vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               ::at(&this->_m_qFunction,__n);
      pvVar3 = std::
               vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               ::at(pvVar2,(ulong)uVar1);
      sVar5 = sVar5 + ((long)(pvVar3->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar3->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>).
                            _M_impl.super__Vector_impl_data._M_start) / 0x28;
      uVar1 = uVar1 + 1;
    }
  }
  return sVar5;
}

Assistant:

size_t MonahanPlanner::GetNrVectors() const
{
    size_t k=0;
    for(Index t=0;t!=_m_qFunction.size();++t)
        for(Index a=0;a!=_m_qFunction.at(t).size();++a)
            k+=_m_qFunction.at(t).at(a).size();

    return(k);
}